

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

void __thiscall
mp::BasicExprFactory<AllocatorRef<MockAllocator,_char>_>::~BasicExprFactory
          (BasicExprFactory<AllocatorRef<MockAllocator,_char>_> *this)

{
  ~BasicExprFactory(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~BasicExprFactory() {
    Deallocate(exprs_);
    Deallocate(funcs_);
  }